

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::OptionalFilter::Deserialize(OptionalFilter *this,Deserializer *deserializer)

{
  OptionalFilter *this_00;
  pointer pOVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_28;
  _Head_base<0UL,_duckdb::OptionalFilter_*,_false> local_20;
  
  this_00 = (OptionalFilter *)operator_new(0x18);
  local_28._M_head_impl = (TableFilter *)0x0;
  OptionalFilter(this_00,(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&local_28);
  local_20._M_head_impl = this_00;
  if (local_28._M_head_impl != (TableFilter *)0x0) {
    (*(local_28._M_head_impl)->_vptr_TableFilter[1])();
  }
  local_28._M_head_impl = (TableFilter *)0x0;
  pOVar1 = unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>::
           operator->((unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                       *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
            (deserializer,200,"child_filter",&pOVar1->child_filter);
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> OptionalFilter::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<OptionalFilter>(new OptionalFilter());
	deserializer.ReadPropertyWithDefault<unique_ptr<TableFilter>>(200, "child_filter", result->child_filter);
	return std::move(result);
}